

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O3

bool __thiscall GPIO::DigitalIn::debounce(DigitalIn *this)

{
  unsigned_long *puVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  timespec local_38;
  
  puVar1 = GPIOBase::gpio_addr;
  uVar6 = (ulong)(this->m_pin >> 5);
  GPIOBase::gpio_addr[uVar6 + 0xd] =
       GPIOBase::gpio_addr[uVar6 + 0xd] & (long)(1 << ((byte)this->m_pin & 0x1f));
  if (((this->m_pullupdown != UP ^ this->m_state ^ puVar1[uVar6 + 0xd] != 0) & 1U) == 0) {
    if ((this->m_min_trigger_interval).__r == 0) {
      return true;
    }
    lVar4 = std::chrono::_V2::steady_clock::now();
    if ((this->m_min_trigger_interval).__r <= lVar4 - (this->m_last_triggered).__d.__r) {
      local_38.tv_nsec = (this->m_min_hold_interval).__r;
      if (local_38.tv_nsec < 1) {
        bVar2 = this->m_state;
      }
      else {
        local_38.tv_sec = (ulong)local_38.tv_nsec / 1000000000;
        local_38.tv_nsec = (ulong)local_38.tv_nsec % 1000000000;
        do {
          iVar3 = nanosleep(&local_38,&local_38);
          if (iVar3 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        puVar1 = GPIOBase::gpio_addr;
        uVar6 = (ulong)(this->m_pin >> 5);
        GPIOBase::gpio_addr[uVar6 + 0xd] =
             GPIOBase::gpio_addr[uVar6 + 0xd] & (long)(1 << ((byte)this->m_pin & 0x1f));
        bVar2 = this->m_state;
        if (((this->m_pullupdown != UP ^ bVar2 ^ puVar1[uVar6 + 0xd] != 0) & 1) != 0) {
          return false;
        }
      }
      (this->m_last_triggered).__d.__r = lVar4;
      this->m_state = (bool)(bVar2 ^ 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool DigitalIn::debounce()
{
    // check if the input has the expected state

    if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    
    // is this a truly perfect digital 0 1 input? Then do not debounce..

    if (m_min_trigger_interval.count() == 0) return true;
    
    auto now = std::chrono::steady_clock::now();
    if ((now - m_last_triggered) < m_min_trigger_interval) return false;

    if (m_min_hold_interval.count() > 0) {

        // sleep a wink

        std::this_thread::sleep_for(m_min_hold_interval);
    
        // and check if the pin is still triggered (pin is 0 if pulldown and switch closed, otherwise 1

        if (m_gpio.read(m_pin) != ((m_pullupdown != GPIO_PULL::UP) ? !m_state : m_state)) return false;
    }
    
    // finally assign this event as the last trigger

    m_last_triggered = now;
    
    // toggle state

    m_state = !m_state;
    
    // and return success

    return true;
}